

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O1

void sdf::RenderNormal(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps
                      ,float max_ray_length,float precision,
                      vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                      Mat *Normals)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Vector3d normal_vector;
  double D_prev;
  Mat Nmap;
  ulong local_190;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  double local_158;
  undefined1 local_148 [24];
  Affine3d *local_130;
  double local_128;
  double local_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  ulong local_e0;
  ulong local_d8;
  Vector4f *local_d0;
  ulong local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  Vector3d local_a8;
  Mat local_90 [16];
  long local_80;
  long *local_48;
  
  local_148._0_4_ = max_ray_length;
  local_130 = transformation;
  local_d0 = cam_params;
  cv::Mat::Mat(local_90,rows,cols,0x15);
  if (0 < rows) {
    local_f8 = (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[8] * 0.0 +
               (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[4] * 0.0 +
               (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[0] * 0.0 +
               (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[0xc];
    dStack_f0 = (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                m_storage.m_data.array[9] * 0.0 +
                (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                m_storage.m_data.array[5] * 0.0 +
                (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                m_storage.m_data.array[1] * 0.0 +
                (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                m_storage.m_data.array[0xd];
    dVar8 = (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[10] * 0.0 +
            (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[6] * 0.0 +
            (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[2] * 0.0 +
            (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xe];
    local_c0 = (double)(float)local_148._0_4_;
    local_120 = (double)precision;
    local_d8 = (ulong)(uint)cols;
    local_190 = 0;
    local_e0 = (ulong)(uint)rows;
    do {
      if (0 < cols) {
        local_b8 = ZEXT416((uint)(float)(int)local_190);
        uVar6 = 0;
        do {
          uVar1 = *(undefined8 *)
                   ((local_d0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                    m_storage.m_data.array + 2);
          auVar11._0_8_ = (double)((float)(int)uVar6 - (float)uVar1);
          auVar11._8_8_ = (double)((float)local_b8._0_4_ - (float)((ulong)uVar1 >> 0x20));
          uVar1 = *(undefined8 *)
                   (local_d0->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage
                   .m_data.array;
          dVar9 = (double)(float)((ulong)uVar1 >> 0x20);
          auVar12._8_4_ = SUB84(dVar9,0);
          auVar12._0_8_ = (double)(float)uVar1;
          auVar12._12_4_ = (int)((ulong)dVar9 >> 0x20);
          auVar12 = divpd(auVar11,auVar12);
          dVar9 = auVar12._0_8_;
          dVar10 = auVar12._8_8_;
          dStack_100 = (local_130->m_matrix).
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array[6] * dVar10;
          local_148._0_8_ =
               (dVar10 * (local_130->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array[4] +
                dVar9 * (local_130->m_matrix).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array[0] +
                (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                m_storage.m_data.array[8] +
               (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[0xc]) - local_f8;
          local_148._8_8_ =
               (dVar10 * (local_130->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array[5] +
                dVar9 * (local_130->m_matrix).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array[1] +
                (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                m_storage.m_data.array[9] +
               (local_130->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[0xd]) - dStack_f0;
          local_108 = (dStack_100 +
                       (local_130->m_matrix).
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array[2] * dVar9 +
                       (local_130->m_matrix).
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array[10] +
                      (local_130->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0xe]) - dVar8;
          auVar13._0_8_ =
               local_108 * local_108 +
               (double)local_148._8_8_ * (double)local_148._8_8_ +
               (double)local_148._0_8_ * (double)local_148._0_8_;
          if (0.0 < auVar13._0_8_) {
            auVar13._8_8_ = 0;
            auVar12 = sqrtpd(auVar13,auVar13);
            auVar14._0_8_ = auVar12._0_8_;
            local_108 = local_108 / auVar14._0_8_;
            auVar14._8_8_ = auVar14._0_8_;
            local_148._0_16_ = divpd(local_148._0_16_,auVar14);
          }
          bVar4 = false;
          local_128 = 0.0;
          uVar15 = 0;
          uVar16 = 0;
          dVar10 = 1.0;
          iVar7 = 0;
          dVar9 = 0.4;
          local_c8 = uVar6;
          while( true ) {
            if (max_steps <= iVar7) break;
            if ((local_c0 <= dVar9) || (bVar4)) break;
            local_168._8_8_ = dVar9 * local_148._8_8_ + dStack_f0;
            local_168._0_8_ = dVar9 * local_148._0_8_ + local_f8;
            auVar2._8_4_ = uVar15;
            auVar2._0_8_ = dVar9;
            auVar2._12_4_ = uVar16;
            local_158 = local_108 * dVar9 + dVar8;
            local_118 = dVar10;
            dVar10 = SDF((Vector3d *)local_168,primitives);
            if (dVar10 < local_120) {
              uStack_170 = auVar2._8_8_;
              local_118 = ((dVar9 - local_128) * local_118) / (local_118 - (dVar10 - local_120)) +
                          local_128;
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] = local_118 * (double)local_148._0_8_ + local_f8;
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] = local_118 * (double)local_148._8_8_ + dStack_f0;
              uStack_110 = uStack_170;
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] = local_108 * local_118 + dVar8;
              SDFGradient((Vector3d *)local_168,&local_a8,primitives);
              auVar17._0_8_ =
                   local_158 * local_158 +
                   local_168._8_8_ * local_168._8_8_ + local_168._0_8_ * local_168._0_8_;
              if (0.0 < auVar17._0_8_) {
                auVar17._8_8_ = 0;
                auVar12 = sqrtpd(auVar17,auVar17);
                auVar18._0_8_ = auVar12._0_8_;
                local_158 = local_158 / auVar18._0_8_;
                auVar18._8_8_ = auVar18._0_8_;
                local_168 = divpd(local_168,auVar18);
              }
              lVar5 = *local_48 * local_190 + local_80;
              *(float *)(lVar5 + 8 + uVar6 * 0xc) = (float)(double)local_168._8_8_;
              *(ulong *)(lVar5 + uVar6 * 0xc) =
                   CONCAT44((float)(double)local_168._0_8_,(float)local_158);
              bVar4 = true;
              uVar15 = (undefined4)uStack_110;
              uVar16 = (undefined4)((ulong)uStack_110 >> 0x20);
              dVar3 = local_118;
            }
            else {
              iVar7 = iVar7 + 1;
              dVar3 = dVar9 + dVar10;
              local_128 = dVar9;
            }
            dVar9 = dVar3;
            if (dVar10 < local_120) break;
          }
          if (!bVar4) {
            lVar5 = *local_48 * local_190 + local_80;
            *(undefined8 *)(lVar5 + uVar6 * 0xc) = 0x7fc000007fc00000;
            *(undefined4 *)(lVar5 + 8 + uVar6 * 0xc) = 0x7fc00000;
          }
          uVar6 = local_c8 + 1;
        } while (uVar6 != local_d8);
      }
      local_190 = local_190 + 1;
    } while (local_190 != local_e0);
  }
  cv::Mat::operator=(Normals,local_90);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void RenderNormal(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length, 
    const float precision, 
    std::vector<Primitive*> &primitives,
    cv::Mat &Normals)
  {
    
    cv::Mat Nmap(rows, cols, CV_32FC3);
    const Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
    const Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized(); 
    
    //Rendering loop
   #pragma omp parallel for collapse(2)
    for(int u = 0; u < rows; ++u)
    {
      for(int v = 0; v < cols; ++v)
      {
        bool hit = false;

        Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;
        p.normalize();
              
        double scaling = 0.4;
        double scaling_prev=0;
        double D = 1.0;
        int steps=0;
        while(steps<max_steps && scaling < max_ray_length && !hit)
        { 

          double D_prev = D;
          D = SDF(camera + p*scaling, primitives);
          if(D < precision)
          {
            scaling = scaling_prev + (scaling-scaling_prev)*D_prev/(D_prev - (D - precision));

            hit = true;
            Eigen::Vector3d normal_vector = SDFGradient(camera + p*scaling,primitives);            
            normal_vector.normalize();

            Nmap.at<cv::Vec3f>(u,v)[1]=(normal_vector(0));
            Nmap.at<cv::Vec3f>(u,v)[2]=(normal_vector(1));
            Nmap.at<cv::Vec3f>(u,v)[0]=(normal_vector(2));

            break;
          }
          scaling_prev = scaling;
          scaling += D;  
          ++steps;        
        }//ray
        if(!hit)     
        {
          Nmap.at<cv::Vec3f>(u,v)[0]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[1]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[2]=std::numeric_limits<float>::quiet_NaN();
        
        }//no hit
      }//col
    }//row 

    Normals = Nmap;
    return;
  }